

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O0

void __thiscall
ctemplate::TemplateTemplateNode::DumpToString(TemplateTemplateNode *this,int level,string *out)

{
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [32];
  string *local_20;
  string *out_local;
  TemplateTemplateNode *pTStack_10;
  int level_local;
  TemplateTemplateNode *this_local;
  
  local_20 = out;
  out_local._4_4_ = level;
  pTStack_10 = this;
  if (out != (string *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"Template Node: ",&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"\n",&local_79);
    AppendTokenWithIndent(level,out,(string *)local_40,&this->token_,(string *)local_78);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    return;
  }
  __assert_fail("out",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                ,0x480,
                "virtual void ctemplate::TemplateTemplateNode::DumpToString(int, string *) const");
}

Assistant:

virtual void DumpToString(int level, string *out) const {
    assert(out);
    AppendTokenWithIndent(level, out, "Template Node: ", token_, "\n");
  }